

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O0

char * get_GLSL_const_array_varname(Context *ctx,int base,int size)

{
  char *pcVar1;
  char local_58 [8];
  char buf [64];
  int size_local;
  int base_local;
  Context *ctx_local;
  
  buf._56_4_ = size;
  buf._60_4_ = base;
  get_GLSL_const_array_varname_in_buf(ctx,base,size,local_58,0x40);
  pcVar1 = StrDup(ctx,local_58);
  return pcVar1;
}

Assistant:

static const char *get_GLSL_const_array_varname(Context *ctx, int base, int size)
{
    char buf[64];
    get_GLSL_const_array_varname_in_buf(ctx, base, size, buf, sizeof (buf));
    return StrDup(ctx, buf);
}